

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O3

string * __thiscall lf::base::RefEl::ToString_abi_cxx11_(string *__return_storage_ptr__,RefEl *this)

{
  runtime_error *this_00;
  char *pcVar1;
  char *pcVar2;
  stringstream ss;
  string local_200;
  string local_1e0;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  switch(this->type_) {
  case kPoint:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "NODE";
    pcVar1 = "";
    break;
  case kSegment:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "EDGE";
    pcVar1 = "";
    break;
  case kTria:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "TRIA";
    pcVar1 = "";
    break;
  case kQuad:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = "QUAD";
    pcVar1 = "";
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_190,"ToString() not implemented for this RefElType",0x2d);
    local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"false","");
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/ref_el.h"
               ,"");
    std::__cxx11::stringbuf::str();
    AssertionFailed(&local_1e0,&local_200,0x1d5,&local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
      operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string ToString() const {
    switch (type_) {
      case RefElType::kPoint:
        return "NODE";
      case RefElType::kSegment:
        return "EDGE";
      case RefElType::kTria:
        return "TRIA";
      case RefElType::kQuad:
        return "QUAD";
      default:
        LF_VERIFY_MSG(false, "ToString() not implemented for this RefElType");
    }
  }